

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

int nk_is_word_boundary(nk_text_edit *state,int idx)

{
  char *pcVar1;
  uint uVar2;
  nk_rune c;
  int len;
  
  uVar2 = 1;
  if (0 < idx) {
    pcVar1 = nk_str_at_rune(&state->string,idx,&c,&len);
    if (pcVar1 != (char *)0x0) {
      if ((((0x3b < (ulong)c) || ((0x800130100000200U >> ((ulong)c & 0x3f) & 1) == 0)) &&
          ((0x22 < c - 0x5b || ((0x500000005U >> ((ulong)(c - 0x5b) & 0x3f) & 1) == 0)))) &&
         (c != 0x3000)) {
        uVar2 = (uint)(c == 0x7c);
      }
    }
  }
  return uVar2;
}

Assistant:

NK_INTERN int
nk_is_word_boundary( struct nk_text_edit *state, int idx)
{
    int len;
    nk_rune c;
    if (idx <= 0) return 1;
    if (!nk_str_at_rune(&state->string, idx, &c, &len)) return 1;
    return (c == ' ' || c == '\t' ||c == 0x3000 || c == ',' || c == ';' ||
            c == '(' || c == ')' || c == '{' || c == '}' || c == '[' || c == ']' ||
            c == '|');
}